

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O0

void __thiscall wabt::anon_unknown_1::BinaryWriter::EndSection(BinaryWriter *this)

{
  bool bVar1;
  Offset OVar2;
  vector<wabt::Reloc,_std::allocator<wabt::Reloc>_> *this_00;
  reference pRVar3;
  Reloc *reloc;
  iterator __end3;
  iterator __begin3;
  vector<wabt::Reloc,_std::allocator<wabt::Reloc>_> *__range3;
  Offset delta;
  BinaryWriter *this_local;
  
  if (this->last_section_leb_size_guess_ == 0) {
    __assert_fail("last_section_leb_size_guess_ != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/binary-writer.cc"
                  ,0x110,"void wabt::(anonymous namespace)::BinaryWriter::EndSection()");
  }
  OVar2 = WriteFixupU32Leb128Size
                    (this,this->last_section_offset_,this->last_section_leb_size_guess_,
                     "FIXUP section size");
  if ((this->current_reloc_section_ != (RelocSection *)0x0) && (OVar2 != 0)) {
    this_00 = &this->current_reloc_section_->relocations;
    __end3 = std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::begin(this_00);
    reloc = (Reloc *)std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<wabt::Reloc_*,_std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>_>
                                       *)&reloc), bVar1) {
      pRVar3 = __gnu_cxx::
               __normal_iterator<wabt::Reloc_*,_std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>_>
               ::operator*(&__end3);
      pRVar3->offset = OVar2 + pRVar3->offset;
      __gnu_cxx::
      __normal_iterator<wabt::Reloc_*,_std::vector<wabt::Reloc,_std::allocator<wabt::Reloc>_>_>::
      operator++(&__end3);
    }
  }
  this->last_section_leb_size_guess_ = 0;
  this->section_count_ = this->section_count_ + 1;
  return;
}

Assistant:

void BinaryWriter::EndSection() {
  assert(last_section_leb_size_guess_ != 0);
  Offset delta = WriteFixupU32Leb128Size(
      last_section_offset_, last_section_leb_size_guess_, "FIXUP section size");
  if (current_reloc_section_ && delta != 0) {
    for (Reloc& reloc : current_reloc_section_->relocations) {
      reloc.offset += delta;
    }
  }
  last_section_leb_size_guess_ = 0;
  section_count_++;
}